

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t uloc_kw_countKeywords(UEnumeration *en,UErrorCode *param_2)

{
  size_t sVar1;
  int32_t iVar2;
  char *__s;
  
  __s = *en->context;
  if (*__s == '\0') {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      sVar1 = strlen(__s);
      __s = __s + sVar1 + 1;
    } while (*__s != '\0');
  }
  return iVar2;
}

Assistant:

static int32_t U_CALLCONV
uloc_kw_countKeywords(UEnumeration *en, UErrorCode * /*status*/) {
    char *kw = ((UKeywordsContext *)en->context)->keywords;
    int32_t result = 0;
    while(*kw) {
        result++;
        kw += uprv_strlen(kw)+1;
    }
    return result;
}